

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::remove_leading_zeros(bigint *this)

{
  size_t sVar1;
  uint *puVar2;
  buffer<unsigned_int> *in_RDI;
  int num_bigits;
  size_t in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  int local_c;
  
  sVar1 = buffer<unsigned_int>::size(in_RDI);
  local_c = (int)sVar1;
  do {
    local_c = local_c + -1;
    uVar3 = false;
    if (0 < local_c) {
      puVar2 = buffer<unsigned_int>::operator[]<int>(in_RDI,local_c);
      uVar3 = *puVar2 == 0;
    }
  } while ((bool)uVar3 != false);
  to_unsigned<int>(0);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::resize
            ((basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FMT_CONSTEXPR void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }